

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float tcu::unnormalize(WrapMode mode,float c,int size)

{
  float fVar1;
  double dVar2;
  int size_local;
  float c_local;
  WrapMode mode_local;
  
  if (REPEAT_GL < mode) {
    if (mode == REPEAT_CL) {
      fVar1 = ::deFloatFloor(c);
      return (float)size * (c - fVar1);
    }
    if (mode != MIRRORED_REPEAT_GL) {
      if (mode == MIRRORED_REPEAT_CL) {
        dVar2 = rint((double)(ulong)(uint)(c * 0.5));
        fVar1 = deFloatAbs(c - (SUB84(dVar2,0) + SUB84(dVar2,0)));
        return (float)size * fVar1;
      }
      if (mode != MIRRORED_ONCE) {
        return 0.0;
      }
    }
  }
  return (float)size * c;
}

Assistant:

static inline float unnormalize (Sampler::WrapMode mode, float c, int size)
{
	switch (mode)
	{
		case tcu::Sampler::CLAMP_TO_EDGE:
		case tcu::Sampler::CLAMP_TO_BORDER:
		case tcu::Sampler::REPEAT_GL:
		case tcu::Sampler::MIRRORED_REPEAT_GL:
		case tcu::Sampler::MIRRORED_ONCE:		// Fall-through (ordinary case).
			return (float)size*c;

		case tcu::Sampler::REPEAT_CL:
			return (float)size * (c - deFloatFloor(c));

		case tcu::Sampler::MIRRORED_REPEAT_CL:
			return (float)size * deFloatAbs(c - 2.0f * rint(0.5f * c));

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}